

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall
lan::db::set_bit<bool>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,bool value)

{
  void *pvVar1;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  set_bit(this,context,var,&local_50,type);
  std::__cxx11::string::~string((string *)&local_50);
  pvVar1 = operator_new(1);
  *(bool *)pvVar1 = value;
  var->data = pvVar1;
  return true;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }